

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# script.cpp
# Opt level: O3

LinkerScriptToken * nextToken(void)

{
  LinkerScriptTokenAttr LVar1;
  char cVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  char *pcVar8;
  LinkerScriptToken *extraout_RAX;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  char *pcVar12;
  size_t sVar13;
  char **ppcVar14;
  SectionTypeInfo *pSVar15;
  bool bVar16;
  LinkerScriptToken *pLVar7;
  
  if (nextToken::token.type == TOKEN_STRING) {
    free(nextToken::token.attr.string);
  }
  do {
    do {
      uVar3 = nextChar();
      pLVar7 = (LinkerScriptToken *)CONCAT44(extraout_var,uVar3);
    } while (uVar3 == 9);
  } while (uVar3 == 0x20);
  if (uVar3 == 0x3b) {
    do {
      do {
        uVar3 = nextChar();
        uVar9 = uVar3 + 1;
        pLVar7 = (LinkerScriptToken *)(ulong)uVar9;
      } while (0xe < uVar9);
    } while ((0x4801U >> (uVar9 & 0x1f) & 1) == 0);
  }
  if ((int)uVar3 < 0xd) {
    if (uVar3 == 0xffffffff) {
      nextToken::token.type = TOKEN_EOF;
      return pLVar7;
    }
    if (uVar3 != 10) {
LAB_00107e42:
      sVar13 = 8;
      uVar10 = 0;
      pcVar8 = (char *)0x0;
      do {
        if (sVar13 <= uVar10 || pcVar8 == (char *)0x0) {
          sVar13 = sVar13 * 2;
          pcVar8 = (char *)realloc(pcVar8,sVar13);
          if (pcVar8 == (char *)0x0) {
            pcVar8 = "%s: Failed to allocate memory for token";
LAB_0010808d:
            err(pcVar8,"nextToken");
          }
        }
        iVar5 = toupper(uVar3);
        pcVar8[uVar10] = (char)iVar5;
        if (uVar3 == 0) goto LAB_00107ed8;
        uVar3 = nextChar();
        if ((uVar3 < 0x3c) && ((0x800000100002600U >> ((ulong)uVar3 & 0x3f) & 1) != 0)) {
          ungetc(uVar3,(FILE *)linkerScript);
          uVar3 = 0;
        }
        uVar10 = uVar10 + 1;
      } while( true );
    }
  }
  else if (uVar3 != 0xd) {
    if (uVar3 == 0x22) {
      nextToken::token.type = TOKEN_STRING;
      nextToken::token.attr.string = (char *)0x0;
      sVar13 = 0x10;
      uVar10 = 0;
      do {
        iVar5 = nextChar();
        if (iVar5 < 0x22) {
          if (((iVar5 == -1) || (iVar5 == 10)) || (iVar4 = iVar5, iVar5 == 0xd)) {
LAB_00108013:
            pcVar8 = "%s(%u): Unterminated string";
            goto LAB_0010802a;
          }
        }
        else {
          iVar4 = 0;
          if ((iVar5 != 0x22) && (iVar4 = iVar5, iVar5 == 0x5c)) {
            iVar4 = nextChar();
            if (iVar4 < 0x6e) {
              if (iVar4 < 0x22) {
                if (((iVar4 == -1) || (iVar4 == 10)) || (iVar4 == 0xd)) goto LAB_00108013;
              }
              else if ((iVar4 == 0x22) || (iVar4 == 0x5c)) goto LAB_00107db8;
LAB_00108064:
              pcVar8 = "%s(%u): Illegal character escape";
LAB_0010802a:
              errx(pcVar8,linkerScriptName,(ulong)lineNo);
            }
            if (iVar4 == 0x6e) {
              iVar4 = 10;
            }
            else if (iVar4 == 0x72) {
              iVar4 = 0xd;
            }
            else {
              if (iVar4 != 0x74) goto LAB_00108064;
              iVar4 = 9;
            }
          }
        }
LAB_00107db8:
        if (nextToken::token.attr.string == (char *)0x0 || sVar13 <= uVar10) {
          sVar13 = sVar13 * 2;
          nextToken::token.attr.string = (char *)realloc(nextToken::token.attr.string,sVar13);
          if (nextToken::token.attr.string == (char *)0x0) {
            pcVar8 = "%s: Failed to allocate memory for string";
            nextToken::token.attr.string = (char *)0x0;
            goto LAB_0010808d;
          }
        }
        LVar1 = nextToken::token.attr;
        nextToken::token.attr.string[uVar10] = (char)iVar4;
        uVar10 = uVar10 + 1;
        if (iVar4 == 0) {
          return (LinkerScriptToken *)LVar1.string;
        }
      } while( true );
    }
    goto LAB_00107e42;
  }
  nextToken::token.type = TOKEN_NEWLINE;
  if (uVar3 == 0xd) {
    iVar5 = nextChar();
    pLVar7 = (LinkerScriptToken *)CONCAT44(extraout_var_00,iVar5);
    if (iVar5 != 10) {
      iVar5 = ungetc(iVar5,(FILE *)linkerScript);
      return (LinkerScriptToken *)CONCAT44(extraout_var_01,iVar5);
    }
  }
  return pLVar7;
LAB_00107ed8:
  nextToken::token.type = TOKEN_INVALID;
  ppcVar14 = commands;
  lVar11 = 0;
  do {
    iVar5 = strcmp(*ppcVar14,pcVar8);
    if (iVar5 == 0) {
      nextToken::token.type = TOKEN_COMMAND;
      goto LAB_0010803b;
    }
    lVar11 = lVar11 + 1;
    ppcVar14 = ppcVar14 + 1;
  } while (lVar11 != 3);
  pSVar15 = sectionTypeInfo;
  lVar11 = 0;
  do {
    iVar5 = strcmp(pSVar15->name,pcVar8);
    if (iVar5 == 0) {
      nextToken::token.type = TOKEN_BANK;
LAB_0010803b:
      nextToken::token.attr.command = (int)lVar11;
      goto LAB_00108042;
    }
    lVar11 = lVar11 + 1;
    pSVar15 = pSVar15 + 1;
  } while (lVar11 != 8);
  iVar5 = strcmp("INCLUDE",pcVar8);
  if (iVar5 == 0) {
    nextToken::token.type = TOKEN_INCLUDE;
  }
  else {
    bVar16 = *pcVar8 == '$';
    uVar3 = 10;
    if (bVar16) {
      uVar3 = 0x10;
    }
    if (pcVar8[bVar16] == '\0') {
LAB_0010809b:
      errx("%s(%u): Unknown token \"%s\"",linkerScriptName,(ulong)lineNo,pcVar8);
    }
    pcVar12 = pcVar8 + bVar16;
    nextToken::token.attr.string = nextToken::token.attr.string & 0xffffffff00000000;
    cVar2 = *pcVar12;
    iVar5 = 0;
    do {
      uVar6 = toupper((int)cVar2);
      uVar9 = 0;
      if ((uVar6 & 0xff) != 0x30) {
        uVar10 = 0;
        do {
          uVar9 = uVar3;
          if ((byte)((char)uVar3 - 1) == uVar10) goto LAB_00107fcb;
          lVar11 = uVar10 + 1;
          uVar10 = uVar10 + 1;
        } while ((char)uVar6 != tryParseNumber(char_const*,unsigned_int*)::digits[lVar11]);
        uVar9 = (uint)uVar10 & 0xff;
LAB_00107fcb:
        if (uVar3 == uVar9) goto LAB_0010809b;
      }
      pcVar12 = pcVar12 + 1;
      iVar5 = iVar5 * uVar3 + uVar9;
      nextToken::token.attr.command = iVar5;
      cVar2 = *pcVar12;
    } while (cVar2 != '\0');
    nextToken::token.type = TOKEN_NUMBER;
  }
LAB_00108042:
  free(pcVar8);
  return extraout_RAX;
}

Assistant:

static struct LinkerScriptToken *nextToken(void)
{
	static struct LinkerScriptToken token;
	int curchar;

	// If the token has a string, make sure to avoid leaking it
	if (token.type == TOKEN_STRING)
		free(token.attr.string);

	// Skip initial whitespace...
	do
		curchar = nextChar();
	while (isWhiteSpace(curchar));

	// If this is a comment, skip to the end of the line
	if (curchar == ';') {
		do {
			curchar = nextChar();
		} while (!isNewline(curchar) && curchar != EOF);
	}

	if (curchar == EOF) {
		token.type = TOKEN_EOF;
	} else if (isNewline(curchar)) {
		// If we have a newline char, this is a newline token
		token.type = TOKEN_NEWLINE;

		if (curchar == '\r') {
			// Handle CRLF
			curchar = nextChar();
			if (curchar != '\n')
				ungetc(curchar, linkerScript);
		}
	} else if (curchar == '"') {
		// If we have a string start, this is a string
		token.type = TOKEN_STRING;
		token.attr.string = NULL; // Force initial alloc

		size_t size = 0;
		size_t capacity = 16; // Half of the default capacity

		do {
			curchar = nextChar();
			if (curchar == EOF || isNewline(curchar)) {
				errx("%s(%" PRIu32 "): Unterminated string",
				     linkerScriptName, lineNo);
			} else if (curchar == '"') {
				// Quotes force a string termination
				curchar = '\0';
			} else if (curchar == '\\') {
				// Backslashes are escape sequences
				curchar = nextChar();
				if (curchar == EOF || isNewline(curchar))
					errx("%s(%" PRIu32 "): Unterminated string",
					     linkerScriptName, lineNo);
				else if (curchar == 'n')
					curchar = '\n';
				else if (curchar == 'r')
					curchar = '\r';
				else if (curchar == 't')
					curchar = '\t';
				else if (curchar != '\\' && curchar != '"')
					errx("%s(%" PRIu32 "): Illegal character escape",
					     linkerScriptName, lineNo);
			}

			if (size >= capacity || token.attr.string == NULL) {
				capacity *= 2;
				token.attr.string = (char *)realloc(token.attr.string, capacity);
				if (!token.attr.string)
					err("%s: Failed to allocate memory for string",
					    __func__);
			}
			token.attr.string[size++] = curchar;
		} while (curchar);
	} else {
		// This is either a number, command or bank, that is: a word
		char *str = NULL;
		size_t size = 0;
		size_t capacity = 8; // Half of the default capacity

		for (;;) {
			if (size >= capacity || str == NULL) {
				capacity *= 2;
				str = (char *)realloc(str, capacity);
				if (!str)
					err("%s: Failed to allocate memory for token",
					    __func__);
			}
			str[size] = toupper(curchar);
			size++;

			if (!curchar)
				break;

			curchar = nextChar();
			// Whitespace, a newline or a comment end the token
			if (isWhiteSpace(curchar) || isNewline(curchar) || curchar == ';') {
				ungetc(curchar, linkerScript);
				curchar = '\0';
			}
		}

		token.type = TOKEN_INVALID;

		// Try to match a command
		for (enum LinkerScriptCommand i : EnumSeq(COMMAND_INVALID)) {
			if (!strcmp(commands[i], str)) {
				token.type = TOKEN_COMMAND;
				token.attr.command = i;
				break;
			}
		}

		if (token.type == TOKEN_INVALID) {
			// Try to match a bank specifier
			for (enum SectionType type : EnumSeq(SECTTYPE_INVALID)) {
				if (!strcmp(sectionTypeInfo[type].name, str)) {
					token.type = TOKEN_BANK;
					token.attr.secttype = type;
					break;
				}
			}
		}

		if (token.type == TOKEN_INVALID) {
			// Try to match an include token
			if (!strcmp("INCLUDE", str))
				token.type = TOKEN_INCLUDE;
		}

		if (token.type == TOKEN_INVALID) {
			// None of the strings matched, do we have a number?
			if (tryParseNumber(str, &token.attr.number))
				token.type = TOKEN_NUMBER;
			else
				errx("%s(%" PRIu32 "): Unknown token \"%s\"",
				     linkerScriptName, lineNo, str);
		}

		free(str);
	}

	return &token;
}